

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::modulefield<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool bVar1;
  string local_b0;
  string local_90 [32];
  undefined1 local_70 [8];
  MaybeResult<wasm::Ok> res;
  MaybeResult<wasm::Ok> _val;
  
  if (((ctx->in).pos == (ctx->in).buffer._M_len) || (bVar1 = Lexer::peekRParen(&ctx->in), bVar1)) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  rectype<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
  if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
    import_<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
    if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
      func<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
      if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
        table<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
        if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
          memory<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
          if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
            global<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
            if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01')
            {
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70
                               );
              export_<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
              if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                  '\x01') {
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                  local_70);
                start<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
                if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                    '\x01') {
                  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>
                  ::~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                      local_70);
                  elem<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
                  if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                      '\x01') {
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70)
                    ;
                    data<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
                    if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                        '\x01') {
                      std::__detail::__variant::
                      _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::~_Variant_storage
                                ((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                 local_70);
                      tag<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
                      if (res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_
                          == '\x01') {
                        std::__detail::__variant::
                        _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::~_Variant_storage
                                  ((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                   local_70);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_b0,"unrecognized module field",
                                   (allocator<char> *)
                                   ((long)&res.val.
                                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                   0x20));
                        Lexer::err((Err *)local_70,&ctx->in,&local_b0);
                        std::__detail::__variant::
                        _Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                        _Variant_storage<2ul,wasm::Err>
                                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                                   __return_storage_ptr__,local_70);
                        std::__cxx11::string::~string((string *)local_70);
                        std::__cxx11::string::~string((string *)&local_b0);
                        return __return_storage_ptr__;
                      }
                      std::__detail::__variant::
                      _Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
                                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                 ((long)&res.val.
                                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                 0x20),(_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                       local_70);
                      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_
                          != '\x02') {
LAB_00c037b5:
                        std::__detail::__variant::
                        _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::~_Variant_storage
                                  ((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                   ((long)&res.val.
                                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                   0x20));
                        *(__index_type *)
                         ((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                         0x20) = '\0';
                        goto LAB_00c037c2;
                      }
                      std::__cxx11::string::string
                                (local_90,(string *)
                                          ((long)&res.val.
                                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                          + 0x20));
                      std::__detail::__variant::
                      _Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                      _Variant_storage<2ul,wasm::Err>
                                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                                 __return_storage_ptr__,local_90);
                    }
                    else {
                      std::__detail::__variant::
                      _Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
                                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                 ((long)&res.val.
                                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                 0x20),(_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                       local_70);
                      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_
                          != '\x02') goto LAB_00c037b5;
                      std::__cxx11::string::string
                                (local_90,(string *)
                                          ((long)&res.val.
                                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                          + 0x20));
                      std::__detail::__variant::
                      _Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                      _Variant_storage<2ul,wasm::Err>
                                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                                 __return_storage_ptr__,local_90);
                    }
                  }
                  else {
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
                              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                               ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                               0x20),(_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                     local_70);
                    if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                        '\x02') goto LAB_00c037b5;
                    std::__cxx11::string::string
                              (local_90,(string *)
                                        ((long)&res.val.
                                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                                .
                                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                .
                                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                .
                                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                .
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                        + 0x20));
                    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>
                    ::_Variant_storage<2ul,wasm::Err>
                              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                               __return_storage_ptr__,local_90);
                  }
                }
                else {
                  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                    ((long)&res.val.
                                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                    + 0x20),(_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>
                                             *)local_70);
                  if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                      '\x02') goto LAB_00c037b5;
                  std::__cxx11::string::string
                            (local_90,(string *)
                                      ((long)&res.val.
                                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                      + 0x20));
                  std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                  _Variant_storage<2ul,wasm::Err>
                            ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                             __return_storage_ptr__,local_90);
                }
              }
              else {
                std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                        .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                0x20),(_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                      local_70);
                if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                    '\x02') goto LAB_00c037b5;
                std::__cxx11::string::string
                          (local_90,(string *)
                                    ((long)&res.val.
                                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                    + 0x20));
                std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                _Variant_storage<2ul,wasm::Err>
                          ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                           __return_storage_ptr__,local_90);
              }
            }
            else {
              std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20
                              ),(_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70)
              ;
              if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                  '\x02') goto LAB_00c037b5;
              std::__cxx11::string::string
                        (local_90,(string *)
                                  ((long)&res.val.
                                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                  0x20));
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
              _Variant_storage<2ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                         __return_storage_ptr__,local_90);
            }
          }
          else {
            std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                            ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                            (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
            if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x02')
            goto LAB_00c037b5;
            std::__cxx11::string::string
                      (local_90,(string *)
                                ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                        .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                0x20));
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,local_90);
          }
        }
        else {
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                          (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
          if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x02')
          goto LAB_00c037b5;
          std::__cxx11::string::string
                    (local_90,(string *)
                              ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20
                              ));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,local_90);
        }
      }
      else {
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                        (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x02')
        goto LAB_00c037b5;
        std::__cxx11::string::string
                  (local_90,(string *)
                            ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20))
        ;
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_90);
      }
    }
    else {
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                      (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x02')
      goto LAB_00c037b5;
      std::__cxx11::string::string
                (local_90,(string *)
                          ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 local_90);
    }
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x02')
    goto LAB_00c037b5;
    std::__cxx11::string::string
              (local_90,(string *)
                        ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_90);
  }
  std::__cxx11::string::~string(local_90);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    ((long)&res.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
LAB_00c037c2:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> modulefield(Ctx& ctx) {
  if (ctx.in.empty() || ctx.in.peekRParen()) {
    return {};
  }
  if (auto res = rectype(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = import_(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = func(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = table(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = memory(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = global(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = export_(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = start(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = elem(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = data(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  if (auto res = tag(ctx)) {
    CHECK_ERR(res);
    return Ok{};
  }
  return ctx.in.err("unrecognized module field");
}